

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void mouse_handling::onMouseWheel(GLFWwindow *window,double dx,double dy)

{
  ImGuiIO *pIVar1;
  double dVar2;
  float fVar3;
  
  pIVar1 = ImGui::GetIO();
  if (pIVar1->WantCaptureMouse == true) {
    ImGui_ImplGlfw_ScrollCallback(window,dx,dy);
    return;
  }
  dVar2 = pow(1.0399999618530273,(double)(float)dy);
  fVar3 = 0.01;
  if (0.01 <= (float)((double)orbitCam.distance * dVar2)) {
    fVar3 = (float)((double)orbitCam.distance * dVar2);
  }
  orbitCam.distance = fVar3;
  return;
}

Assistant:

void onMouseWheel(GLFWwindow* window, double dx, double dy)
    {
        if(ImGui::GetIO().WantCaptureMouse) {
            ImGui_ImplGlfw_ScrollCallback(window, dx, dy);
        }
        else {
            const float speed = 1.04f;
            orbitCam.distance *= pow(speed, (float)dy);
            orbitCam.distance = glm::max(orbitCam.distance, 0.01f);
        }
    }